

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_loadDEntropy(ZSTD_entropyDTables_t *entropy,void *dict,size_t dictSize)

{
  uint uVar1;
  U32 UVar2;
  BYTE *pBVar3;
  void *pvVar4;
  size_t sVar5;
  BYTE *pBVar6;
  U32 rep;
  size_t dictContentSize;
  int i;
  size_t litlengthHeaderSize;
  uint litlengthLog;
  uint litlengthMaxValue;
  short litlengthNCount [36];
  size_t matchlengthHeaderSize;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  size_t offcodeHeaderSize;
  uint offcodeLog;
  uint offcodeMaxValue;
  short offcodeNCount [32];
  size_t hSize;
  size_t workspaceSize;
  void *workspace;
  BYTE *dictEnd;
  BYTE *dictPtr;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_entropyDTables_t *entropy_local;
  
  pBVar3 = (BYTE *)((long)dict + dictSize);
  if (dictSize < 9) {
    entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
  }
  else {
    pvVar4 = (void *)((long)dict + 8);
    sVar5 = HUF_readDTableX2_wksp
                      (entropy->hufTable,pvVar4,(long)pBVar3 - (long)pvVar4,entropy,0x2818);
    uVar1 = ERR_isError(sVar5);
    if (uVar1 == 0) {
      pvVar4 = (void *)(sVar5 + (long)pvVar4);
      offcodeHeaderSize._4_4_ = 0x1f;
      register0x00000000 =
           FSE_readNCount((short *)&offcodeLog,(uint *)((long)&offcodeHeaderSize + 4),
                          (uint *)&offcodeHeaderSize,pvVar4,(long)pBVar3 - (long)pvVar4);
      uVar1 = ERR_isError(register0x00000000);
      if (uVar1 == 0) {
        if (offcodeHeaderSize._4_4_ < 0x20) {
          if ((uint)offcodeHeaderSize < 9) {
            ZSTD_buildFSETable(entropy->OFTable,(short *)&offcodeLog,offcodeHeaderSize._4_4_,OF_base
                               ,OF_bits,(uint)offcodeHeaderSize);
            pvVar4 = (void *)(stack0xffffffffffffff58 + (long)pvVar4);
            matchlengthHeaderSize._4_4_ = 0x34;
            sVar5 = FSE_readNCount((short *)&matchlengthLog,
                                   (uint *)((long)&matchlengthHeaderSize + 4),
                                   (uint *)&matchlengthHeaderSize,pvVar4,(long)pBVar3 - (long)pvVar4
                                  );
            uVar1 = ERR_isError(sVar5);
            if (uVar1 == 0) {
              if (matchlengthHeaderSize._4_4_ < 0x35) {
                if ((uint)matchlengthHeaderSize < 10) {
                  ZSTD_buildFSETable(entropy->MLTable,(short *)&matchlengthLog,
                                     matchlengthHeaderSize._4_4_,ML_base,ML_bits,
                                     (uint)matchlengthHeaderSize);
                  pvVar4 = (void *)(sVar5 + (long)pvVar4);
                  litlengthHeaderSize._4_4_ = 0x23;
                  sVar5 = FSE_readNCount((short *)&litlengthLog,
                                         (uint *)((long)&litlengthHeaderSize + 4),
                                         (uint *)&litlengthHeaderSize,pvVar4,
                                         (long)pBVar3 - (long)pvVar4);
                  uVar1 = ERR_isError(sVar5);
                  if (uVar1 == 0) {
                    if (litlengthHeaderSize._4_4_ < 0x24) {
                      if ((uint)litlengthHeaderSize < 10) {
                        ZSTD_buildFSETable(entropy->LLTable,(short *)&litlengthLog,
                                           litlengthHeaderSize._4_4_,LL_base,LL_bits,
                                           (uint)litlengthHeaderSize);
                        dictEnd = (BYTE *)(sVar5 + (long)pvVar4);
                        if (pBVar3 < dictEnd + 0xc) {
                          entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
                        }
                        else {
                          pBVar6 = dictEnd + 0xc;
                          for (dictContentSize._4_4_ = 0; dictContentSize._4_4_ < 3;
                              dictContentSize._4_4_ = dictContentSize._4_4_ + 1) {
                            UVar2 = MEM_readLE32(dictEnd);
                            dictEnd = dictEnd + 4;
                            if ((UVar2 == 0) ||
                               ((ulong)((long)pBVar3 - (long)pBVar6) <= (ulong)UVar2)) {
                              return 0xffffffffffffffe2;
                            }
                            entropy->rep[dictContentSize._4_4_] = UVar2;
                          }
                          entropy_local = (ZSTD_entropyDTables_t *)(dictEnd + -(long)dict);
                        }
                      }
                      else {
                        entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
                      }
                    }
                    else {
                      entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
                    }
                  }
                  else {
                    entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
                  }
                }
                else {
                  entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
                }
              }
              else {
                entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
              }
            }
            else {
              entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
            }
          }
          else {
            entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
          }
        }
        else {
          entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
        }
      }
      else {
        entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
      }
    }
    else {
      entropy_local = (ZSTD_entropyDTables_t *)0xffffffffffffffe2;
    }
  }
  return (size_t)entropy_local;
}

Assistant:

size_t
ZSTD_loadDEntropy(ZSTD_entropyDTables_t* entropy,
                  const void* const dict, size_t const dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;
    const BYTE* const dictEnd = dictPtr + dictSize;

    if (dictSize <= 8) return ERROR(dictionary_corrupted);
    assert(MEM_readLE32(dict) == ZSTD_MAGIC_DICTIONARY);   /* dict must be valid */
    dictPtr += 8;   /* skip header = magic + dictID */

    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, OFTable) == offsetof(ZSTD_entropyDTables_t, LLTable) + sizeof(entropy->LLTable));
    ZSTD_STATIC_ASSERT(offsetof(ZSTD_entropyDTables_t, MLTable) == offsetof(ZSTD_entropyDTables_t, OFTable) + sizeof(entropy->OFTable));
    ZSTD_STATIC_ASSERT(sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable) >= HUF_DECOMPRESS_WORKSPACE_SIZE);
    {   void* const workspace = &entropy->LLTable;   /* use fse tables as temporary workspace; implies fse tables are grouped together */
        size_t const workspaceSize = sizeof(entropy->LLTable) + sizeof(entropy->OFTable) + sizeof(entropy->MLTable);
#ifdef HUF_FORCE_DECOMPRESS_X1
        /* in minimal huffman, we always use X1 variants */
        size_t const hSize = HUF_readDTableX1_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize);
#else
        size_t const hSize = HUF_readDTableX2_wksp(entropy->hufTable,
                                                dictPtr, dictEnd - dictPtr,
                                                workspace, workspaceSize);
#endif
        if (HUF_isError(hSize)) return ERROR(dictionary_corrupted);
        dictPtr += hSize;
    }

    {   short offcodeNCount[MaxOff+1];
        unsigned offcodeMaxValue = MaxOff, offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, &offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(offcodeHeaderSize)) return ERROR(dictionary_corrupted);
        if (offcodeMaxValue > MaxOff) return ERROR(dictionary_corrupted);
        if (offcodeLog > OffFSELog) return ERROR(dictionary_corrupted);
        ZSTD_buildFSETable( entropy->OFTable,
                            offcodeNCount, offcodeMaxValue,
                            OF_base, OF_bits,
                            offcodeLog);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(matchlengthHeaderSize)) return ERROR(dictionary_corrupted);
        if (matchlengthMaxValue > MaxML) return ERROR(dictionary_corrupted);
        if (matchlengthLog > MLFSELog) return ERROR(dictionary_corrupted);
        ZSTD_buildFSETable( entropy->MLTable,
                            matchlengthNCount, matchlengthMaxValue,
                            ML_base, ML_bits,
                            matchlengthLog);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        if (FSE_isError(litlengthHeaderSize)) return ERROR(dictionary_corrupted);
        if (litlengthMaxValue > MaxLL) return ERROR(dictionary_corrupted);
        if (litlengthLog > LLFSELog) return ERROR(dictionary_corrupted);
        ZSTD_buildFSETable( entropy->LLTable,
                            litlengthNCount, litlengthMaxValue,
                            LL_base, LL_bits,
                            litlengthLog);
        dictPtr += litlengthHeaderSize;
    }

    if (dictPtr+12 > dictEnd) return ERROR(dictionary_corrupted);
    {   int i;
        size_t const dictContentSize = (size_t)(dictEnd - (dictPtr+12));
        for (i=0; i<3; i++) {
            U32 const rep = MEM_readLE32(dictPtr); dictPtr += 4;
            if (rep==0 || rep >= dictContentSize) return ERROR(dictionary_corrupted);
            entropy->rep[i] = rep;
    }   }

    return dictPtr - (const BYTE*)dict;
}